

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLEFetchRow<int>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  unsigned_long skip_count;
  RLEScanState<int> *this;
  idx_t iVar1;
  int *piVar2;
  ColumnSegment *in_RDI;
  long in_R8;
  int *result_data;
  int *data_pointer;
  data_ptr_t data;
  RLEScanState<int> scan_state;
  ColumnSegment *in_stack_ffffffffffffff68;
  RLEScanState<int> *in_stack_ffffffffffffff70;
  long lVar3;
  ColumnSegment *in_stack_ffffffffffffffa8;
  RLEScanState<int> *in_stack_ffffffffffffffb0;
  
  RLEScanState<int>::RLEScanState(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  skip_count = NumericCast<unsigned_long,long,void>(0xa4aa0b);
  RLEScanState<int>::Skip(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,skip_count);
  this = (RLEScanState<int> *)BufferHandle::Ptr((BufferHandle *)0xa4aa32);
  iVar1 = ColumnSegment::GetBlockOffset(in_RDI);
  lVar3 = (long)&(this->handle).handle.internal.
                 super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr + iVar1;
  piVar2 = FlatVector::GetData<int>((Vector *)0xa4aa71);
  piVar2[in_R8] = *(int *)(lVar3 + (long)in_stack_ffffffffffffffb0 * 4);
  RLEScanState<int>::~RLEScanState(this);
  return;
}

Assistant:

void RLEFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	RLEScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto result_data = FlatVector::GetData<T>(result);
	result_data[result_idx] = data_pointer[scan_state.entry_pos];
}